

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::alloc
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,int new_len)

{
  CString *pCVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int i;
  int end;
  CString *new_list;
  CString *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pCVar1 = allocator_default<CLocalizationDatabase::CString>::alloc_array(new_list._4_4_);
  if (*(int *)((long)in_RDI + 0xc) < *(int *)(in_RDI + 1)) {
    iVar3 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar3 = *(int *)(in_RDI + 1);
  }
  iVar4 = iVar3;
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    CLocalizationDatabase::CString::operator=
              ((CString *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  }
  allocator_default<CLocalizationDatabase::CString>::free_array
            ((CString *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (*(int *)((long)in_RDI + 0xc) < *(int *)(in_RDI + 1)) {
    uVar2 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar2 = *(undefined4 *)(in_RDI + 1);
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar2;
  *in_RDI = pCVar1;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}